

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.cpp
# Opt level: O1

TranscodeSwizzleInfo *
ktx::determineTranscodeSwizzle
          (TranscodeSwizzleInfo *__return_storage_ptr__,KTXTexture2 *texture,Reporter *report)

{
  ktxTexture2 *pkVar1;
  ktx_uint32_t *pkVar2;
  uint32_t uVar3;
  size_t sVar4;
  bool bVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  khr_df_model_e colorModel;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_98;
  string *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  string local_68;
  ulong local_48 [3];
  
  __return_storage_ptr__->defaultNumComponents = 0;
  local_70 = &(__return_storage_ptr__->swizzle).field_2;
  (__return_storage_ptr__->swizzle)._M_dataplus._M_p = (pointer)local_70;
  (__return_storage_ptr__->swizzle)._M_string_length = 0;
  (__return_storage_ptr__->swizzle).field_2._M_local_buf[0] = '\0';
  pkVar1 = texture->handle_;
  pkVar2 = pkVar1->pDfd;
  uVar7 = (pkVar2[2] >> 0x12) - 6;
  uVar8 = 0;
  colorModel = KHR_DF_MODEL_UNSPECIFIED;
  if (3 < uVar7) {
    colorModel = *(byte *)((long)pkVar2 + 0x1f) & KHR_DF_MODEL_CIEXYY;
  }
  if (7 < uVar7) {
    uVar8 = *(byte *)((long)pkVar2 + 0x2f) & 0xf;
  }
  local_78 = &__return_storage_ptr__->swizzle;
  if (pkVar1->supercompressionScheme == KTX_SS_BASIS_LZ) {
    __return_storage_ptr__->defaultNumComponents = 0;
    if ((uVar7 < 4) || (colorModel != KHR_DF_MODEL_UNSPECIFIED)) {
      if ((uVar7 < 4) || (colorModel != KHR_DF_MODEL_YIQSDA)) {
        if (uVar7 < 4) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-","");
        }
        else {
          pcVar6 = (char *)dfdToStringChannelId(0xa3,colorModel);
          if (pcVar6 == (char *)0x0) {
            local_68._M_dataplus._M_p = (pointer)(ulong)colorModel;
            fmt.size_ = 2;
            fmt.data_ = (char *)0xa;
            args.field_1.values_ = in_R9.values_;
            args.desc_ = (unsigned_long_long)&local_68;
            ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)"(0x{:01X})",fmt,args);
          }
          else {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            sVar4 = strlen(pcVar6);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,pcVar6,pcVar6 + sVar4);
          }
        }
        if (uVar7 < 8) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"-","");
        }
        else {
          pcVar6 = (char *)dfdToStringChannelId(0xa3,uVar8);
          if (pcVar6 == (char *)0x0) {
            local_48[0] = (ulong)uVar8;
            fmt_00.size_ = 2;
            fmt_00.data_ = (char *)0xa;
            args_00.field_1.args_ = in_R9.args_;
            args_00.desc_ = (unsigned_long_long)local_48;
            ::fmt::v10::vformat_abi_cxx11_(&local_68,(v10 *)"(0x{:01X})",fmt_00,args_00);
          }
          else {
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            sVar4 = strlen(pcVar6);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,pcVar6,pcVar6 + sVar4);
          }
        }
        Reporter::fatal<char_const(&)[59],std::__cxx11::string,std::__cxx11::string>
                  (report,INVALID_FILE,
                   (char (*) [59])"Unsupported channel types for Basis-LZ transcoding: {}, {}",
                   &local_98,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
LAB_001a8b77:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == &local_98.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      bVar5 = uVar8 == 4 && 7 < uVar7;
      uVar3 = bVar5 + 1;
      pcVar9 = "ra01";
      pcVar6 = "r001";
    }
    else {
      bVar5 = uVar8 == 0xf && 7 < uVar7;
      uVar3 = bVar5 + 3;
      pcVar9 = "rgba";
      pcVar6 = "rgb1";
    }
    if (bVar5) {
      pcVar6 = pcVar9;
    }
  }
  else {
    if ((char)pkVar2[3] != -0x5a) {
      Reporter::fatal<char_const(&)[67]>
                (report,INVALID_FILE,
                 (char (*) [67])"Requested transcoding but input file is neither BasisLZ, nor UASTC"
                );
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->defaultNumComponents = 0;
    if ((uVar7 < 4) || (colorModel != KHR_DF_MODEL_YIQSDA)) {
      if ((uVar7 < 4) || (colorModel != KHR_DF_MODEL_UNSPECIFIED)) {
        if ((uVar7 < 4) || (colorModel != KHR_DF_MODEL_CMYKA)) {
          if ((uVar7 < 4) || (colorModel != KHR_DF_MODEL_XYZW)) {
            if ((uVar7 < 4) || (colorModel != KHR_DF_MODEL_LABSDA)) {
              if (uVar7 < 4) {
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-","");
              }
              else {
                toString_abi_cxx11_(&local_98,(ktx *)0xa6,colorModel,(khr_df_model_channels_e)pkVar1
                                   );
              }
              Reporter::fatal<char_const(&)[51],std::__cxx11::string>
                        (report,INVALID_FILE,
                         (char (*) [51])"Unsupported channel type for UASTC transcoding: {}",
                         &local_98);
              goto LAB_001a8b77;
            }
            pcVar6 = "r001";
            uVar3 = 1;
          }
          else {
            pcVar6 = "rg01";
            uVar3 = 2;
          }
          __return_storage_ptr__->defaultNumComponents = uVar3;
          std::__cxx11::string::operator=((string *)local_78,pcVar6);
          return __return_storage_ptr__;
        }
        pcVar6 = "ra01";
        uVar3 = 2;
      }
      else {
        pcVar6 = "rgb1";
        uVar3 = 3;
      }
    }
    else {
      pcVar6 = "rgba";
      uVar3 = 4;
    }
  }
  __return_storage_ptr__->defaultNumComponents = uVar3;
  std::__cxx11::string::_M_replace
            ((ulong)local_78,0,(char *)(__return_storage_ptr__->swizzle)._M_string_length,
             (ulong)pcVar6);
  return __return_storage_ptr__;
}

Assistant:

TranscodeSwizzleInfo determineTranscodeSwizzle(const KTXTexture2& texture, Reporter& report) {
    TranscodeSwizzleInfo result;

    const auto* bdfd = texture->pDfd + 1;
    const auto sample0 = getChannelType(texture, 0);
    const auto sample1 = getChannelType(texture, 1);

    if (texture->supercompressionScheme == KTX_SS_BASIS_LZ) {
        result.defaultNumComponents = 0;
        if (sample0 == KHR_DF_CHANNEL_ETC1S_RGB && sample1 == KHR_DF_CHANNEL_ETC1S_AAA) {
            result.defaultNumComponents = 4;
            result.swizzle = "rgba";
        } else if (sample0 == KHR_DF_CHANNEL_ETC1S_RGB) {
            result.defaultNumComponents = 3;
            result.swizzle = "rgb1";
        } else if (sample0 == KHR_DF_CHANNEL_ETC1S_RRR && sample1 == KHR_DF_CHANNEL_ETC1S_GGG) {
            result.defaultNumComponents = 2;
            result.swizzle = "ra01";
        } else if (sample0 == KHR_DF_CHANNEL_ETC1S_RRR) {
            result.defaultNumComponents = 1;
            result.swizzle = "r001";
        } else {
            report.fatal(rc::INVALID_FILE, "Unsupported channel types for Basis-LZ transcoding: {}, {}",
                    sample0 ? toString(KHR_DF_MODEL_ETC1S, *sample0) : "-",
                    sample1 ? toString(KHR_DF_MODEL_ETC1S, *sample1) : "-");
        }
    } else if (khr_df_model_e(KHR_DFDVAL(bdfd, MODEL)) == KHR_DF_MODEL_UASTC) {
        result.defaultNumComponents = 0;
        if (sample0 == KHR_DF_CHANNEL_UASTC_RGBA) {
            result.defaultNumComponents = 4;
            result.swizzle = "rgba";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RGB) {
            result.defaultNumComponents = 3;
            result.swizzle = "rgb1";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RRRG) {
            result.defaultNumComponents = 2;
            result.swizzle = "ra01";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RG) {
            result.defaultNumComponents = 2;
            result.swizzle = "rg01";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RRR) {
            result.defaultNumComponents = 1;
            result.swizzle = "r001";
        } else {
            report.fatal(rc::INVALID_FILE, "Unsupported channel type for UASTC transcoding: {}",
                    sample0 ? toString(KHR_DF_MODEL_UASTC, *sample0) : "-");
        }
    } else {
        report.fatal(rc::INVALID_FILE, "Requested transcoding but input file is neither BasisLZ, nor UASTC");
    }

    return result;
}